

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

char * fy_token_format_text(fy_token *fyt,char *buf,size_t maxsz)

{
  char *str;
  size_t maxsz_local;
  char *buf_local;
  fy_token *fyt_local;
  
  fyt_local = (fy_token *)buf;
  if (maxsz != 0) {
    if (fyt == (fy_token *)0x0) {
      if (maxsz != 0) {
        *buf = '\0';
      }
    }
    else if (fyt->type == FYTT_TAG_DIRECTIVE) {
      fyt_local = (fy_token *)fy_tag_directive_token_format_text(fyt,buf,maxsz);
    }
    else if (fyt->type == FYTT_TAG) {
      fyt_local = (fy_token *)fy_tag_token_format_text(fyt,buf,maxsz);
    }
    else {
      fyt_local = (fy_token *)fy_atom_format_text(&fyt->handle,buf,maxsz);
    }
  }
  return (char *)fyt_local;
}

Assistant:

const char *fy_token_format_text(struct fy_token *fyt, char *buf, size_t maxsz) {
    const char *str;

    if (maxsz == 0)
        return buf;

    if (!fyt) {
        if (maxsz > 0)
            buf[0] = '\0';
        return buf;
    }

    switch (fyt->type) {

        case FYTT_TAG:
            return fy_tag_token_format_text(fyt, buf, maxsz);

        case FYTT_TAG_DIRECTIVE:
            return fy_tag_directive_token_format_text(fyt, buf, maxsz);

        default:
            break;
    }

    str = fy_atom_format_text(&fyt->handle, buf, maxsz);

    return str;
}